

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Transform *
pbrt::Rotate(Transform *__return_storage_ptr__,Float sinTheta,Float cosTheta,Vector3f *axis)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i_1;
  Float (*paFVar10) [4];
  int i;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  SquareMatrix<4> m;
  SquareMatrix<4> r;
  undefined1 auVar16 [16];
  
  fVar15 = (axis->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar1 = (axis->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar2 = (axis->super_Tuple3<pbrt::Vector3,_float>).z;
  paFVar10 = (Float (*) [4])&m;
  lVar11 = 0;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar1));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar18 = auVar16._0_4_;
  fVar15 = fVar15 / fVar18;
  auVar16 = ZEXT416((uint)fVar15);
  auVar13 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  do {
    auVar12 = vpbroadcastq_avx512vl();
    lVar11 = lVar11 + 1;
    uVar3 = vpcmpeqq_avx512vl(auVar12,auVar13);
    auVar20 = vpmovm2d_avx512vl(uVar3 & 0xf);
    auVar20 = vpsrld_avx(auVar20,0x1f);
    auVar20 = vcvtdq2ps_avx(auVar20);
    *paFVar10 = (Float  [4])auVar20;
    paFVar10 = paFVar10 + 1;
  } while (lVar11 != 4);
  auVar14._0_4_ = fVar1 / fVar18;
  auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar17._0_4_ = fVar2 / fVar18;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  lVar11 = 0;
  paFVar10 = (Float (*) [4])&r;
  fVar1 = 1.0 - cosTheta;
  auVar19 = SUB6416(ZEXT464(0x3f800000),0);
  auVar8 = vfnmadd213ss_fma(auVar14,auVar14,auVar19);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar14._0_4_ * auVar17._0_4_)),
                            ZEXT416((uint)(fVar15 * sinTheta)));
  auVar21 = ZEXT416((uint)fVar1);
  auVar5 = vfmsub213ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar17._0_4_)),auVar21,
                           ZEXT416((uint)(fVar15 * sinTheta)));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * cosTheta)),auVar14,auVar14);
  auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar14._0_4_ * fVar15)),
                           ZEXT416((uint)(auVar17._0_4_ * sinTheta)));
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar14._0_4_ * fVar15)),auVar21,
                           ZEXT416((uint)(auVar17._0_4_ * sinTheta)));
  auVar9 = vfnmadd213ss_fma(auVar16,auVar16,auVar19);
  auVar19 = vfnmadd231ss_fma(auVar19,auVar17,auVar17);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * cosTheta)),auVar16,auVar16);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * cosTheta)),auVar17,auVar17);
  auVar7 = vfmsub213ss_fma(auVar21,ZEXT416((uint)(fVar15 * auVar17._0_4_)),
                           ZEXT416((uint)(auVar14._0_4_ * sinTheta)));
  auVar16 = vfmadd213ss_fma(auVar21,ZEXT416((uint)(fVar15 * auVar17._0_4_)),
                            ZEXT416((uint)(auVar14._0_4_ * sinTheta)));
  do {
    auVar12 = vpbroadcastq_avx512vl();
    lVar11 = lVar11 + 1;
    uVar3 = vpcmpeqq_avx512vl(auVar12,auVar13);
    auVar14 = vpmovm2d_avx512vl(uVar3 & 0xf);
    auVar14 = vpsrld_avx(auVar14,0x1f);
    auVar14 = vcvtdq2ps_avx(auVar14);
    *paFVar10 = (Float  [4])auVar14;
    paFVar10 = paFVar10 + 1;
  } while (lVar11 != 4);
  lVar11 = 0;
  auVar13 = vpbroadcastq_avx512vl();
  auVar13 = vpaddq_avx2(auVar13,_DAT_004fc1a0);
  paFVar10 = (Float (*) [4])&r;
  do {
    auVar12 = vpbroadcastq_avx512vl();
    lVar11 = lVar11 + 1;
    auVar12 = vpsllq_avx2(auVar12,2);
    vpaddq_avx2(auVar13,auVar12);
    auVar14 = vgatherqps_avx512vl(*(undefined8 *)*(Float (*) [4])*paFVar10);
    *paFVar10 = (Float  [4])auVar14;
    paFVar10 = paFVar10 + 1;
  } while (lVar11 != 4);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(auVar6._0_4_,auVar4._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = (ulong)auVar20._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(auVar9._0_4_,auVar8._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = (ulong)auVar7._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(auVar16._0_4_,auVar5._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = (ulong)auVar19._0_4_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = m.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = r.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = r.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = r.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = r.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = r.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = r.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = r.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = r.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline T LengthSquared(const Vector3<T> &v) {
    return v.x * v.x + v.y * v.y + v.z * v.z;
}